

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

bool __thiscall Character::Equip(Character *this,short item,uchar subloc)

{
  uint uVar1;
  World *pWVar2;
  bool bVar3;
  int iVar4;
  EIF_Data *pEVar5;
  ECF_Data *pEVar6;
  EIF_Data *pEVar7;
  EquipLocation slot1;
  uchar subloc_00;
  EquipLocation slot2;
  string local_88;
  string local_68;
  string local_48;
  
  iVar4 = HasItem(this,item,false);
  if (iVar4 == 0) {
    return false;
  }
  pEVar5 = EIF::Get(this->world->eif,(int)item);
  pEVar6 = ECF::Get(this->world->ecf,(uint)this->clas);
  if ((pEVar5->type == Armor) && ((pEVar5->field_26).gender != this->gender)) {
    return false;
  }
  if ((((pEVar5->type == Weapon) && (pEVar5->subtype == TwoHanded)) &&
      (uVar1 = (this->paperdoll)._M_elems[7], uVar1 != 0)) &&
     ((pEVar7 = EIF::Get(this->world->eif,uVar1), (pEVar5->field_27).scrolly != '\0' ||
      ((pEVar7->subtype & ~Ranged) != Arrows)))) {
    pWVar2 = this->world;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"two_handed_fail_1","");
    I18N::Format<>(&local_48,&pWVar2->i18n,&local_88);
    (*(this->super_Command_Source)._vptr_Command_Source[6])(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
LAB_001181f2:
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
LAB_001181fa:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
switchD_00118123_default:
    return false;
  }
  if (((pEVar5->type == Shield) && (uVar1 = (this->paperdoll)._M_elems[8], uVar1 != 0)) &&
     ((pEVar7 = EIF::Get(this->world->eif,uVar1), pEVar7->subtype == TwoHanded &&
      (((pEVar7->field_27).scrolly != '\0' || ((pEVar5->subtype & ~Ranged) != Arrows)))))) {
    pWVar2 = this->world;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"two_handed_fail_2","");
    I18N::Format<>(&local_68,&pWVar2->i18n,&local_88);
    (*(this->super_Command_Source)._vptr_Command_Source[6])(this,&local_68);
    local_48.field_2._M_allocated_capacity = local_68.field_2._M_allocated_capacity;
    local_48._M_dataplus._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) goto LAB_001181f2;
    goto LAB_001181fa;
  }
  if ((short)(ushort)this->level < pEVar5->levelreq) {
    return false;
  }
  if (((ushort)this->clas != pEVar5->classreq) && ((ushort)pEVar6->base != pEVar5->classreq)) {
    return false;
  }
  if (*this->display_str < (int)pEVar5->strreq) {
    return false;
  }
  if (*this->display_intl < (int)pEVar5->intreq) {
    return false;
  }
  if (*this->display_wis < (int)pEVar5->wisreq) {
    return false;
  }
  if (*this->display_agi < (int)pEVar5->agireq) {
    return false;
  }
  if (*this->display_con < (int)pEVar5->conreq) {
    return false;
  }
  if (*this->display_cha < (int)pEVar5->chareq) {
    return false;
  }
  switch(pEVar5->type) {
  case Weapon:
    subloc_00 = '\b';
    break;
  case Shield:
    subloc_00 = '\a';
    break;
  case Armor:
    subloc_00 = '\x04';
    break;
  case Hat:
    subloc_00 = '\x06';
    break;
  case Boots:
    subloc_00 = '\0';
    break;
  case Gloves:
    subloc_00 = '\x02';
    break;
  case Accessory:
    subloc_00 = '\x01';
    break;
  case Belt:
    subloc_00 = '\x03';
    break;
  case Necklace:
    subloc_00 = '\x05';
    break;
  case Ring:
    slot1 = Ring1;
    slot2 = Ring2;
    goto LAB_001182b3;
  case Armlet:
    slot1 = Armlet1;
    slot2 = Armlet2;
    goto LAB_001182b3;
  case Bracer:
    slot1 = Bracer1;
    slot2 = Bracer2;
LAB_001182b3:
    bVar3 = character_equip_twoslot(this,item,subloc,slot1,slot2);
    return bVar3;
  default:
    goto switchD_00118123_default;
  }
  bVar3 = character_equip_oneslot(this,item,subloc_00,0x1a4040);
  return bVar3;
}

Assistant:

bool Character::Equip(short item, unsigned char subloc)
{
	if (!this->HasItem(item))
	{
		return false;
	}

	const EIF_Data &eif = this->world->eif->Get(item);
	const ECF_Data &ecf = this->world->ecf->Get(this->clas);

	if (eif.type == EIF::Armor && eif.gender != this->gender)
	{
		return false;
	}

	if (eif.type == EIF::Weapon && eif.subtype == EIF::TwoHanded)
	{
		if (this->paperdoll[Shield])
		{
			const EIF_Data& shield_eif = this->world->eif->Get(this->paperdoll[Shield]);

			if (eif.dual_wield_dollgraphic || (shield_eif.subtype != EIF::Arrows && shield_eif.subtype != EIF::Wings))
			{
				this->StatusMsg(this->world->i18n.Format("two_handed_fail_1"));
				return false;
			}
		}
	}

	if (eif.type == EIF::Shield)
	{
		if (this->paperdoll[Weapon])
		{
			const EIF_Data& weapon_eif = this->world->eif->Get(this->paperdoll[Weapon]);

			if (weapon_eif.subtype == EIF::TwoHanded
			 && (weapon_eif.dual_wield_dollgraphic || (eif.subtype != EIF::Arrows && eif.subtype != EIF::Wings)))
			{
				this->StatusMsg(this->world->i18n.Format("two_handed_fail_2"));
				return false;
			}
		}
	}

	if (this->level < eif.levelreq || (this->clas != eif.classreq && ecf.base != eif.classreq)
	 || this->display_str < eif.strreq || this->display_intl < eif.intreq
	 || this->display_wis < eif.wisreq || this->display_agi < eif.agireq
	 || this->display_con < eif.conreq || this->display_cha < eif.chareq)
	{
		return false;
	}

	switch (eif.type)
	{
		case EIF::Weapon: return character_equip_oneslot(this, item, subloc, Weapon);
		case EIF::Shield: return character_equip_oneslot(this, item, subloc, Shield);
		case EIF::Hat: return character_equip_oneslot(this, item, subloc, Hat);
		case EIF::Boots: return character_equip_oneslot(this, item, subloc, Boots);
		case EIF::Gloves: return character_equip_oneslot(this, item, subloc, Gloves);
		case EIF::Accessory: return character_equip_oneslot(this, item, subloc, Accessory);
		case EIF::Belt: return character_equip_oneslot(this, item, subloc, Belt);
		case EIF::Armor: return character_equip_oneslot(this, item, subloc, Armor);
		case EIF::Necklace: return character_equip_oneslot(this, item, subloc, Necklace);
		case EIF::Ring: return character_equip_twoslot(this, item, subloc, Ring1, Ring2);
		case EIF::Armlet: return character_equip_twoslot(this, item, subloc, Armlet1, Armlet2);
		case EIF::Bracer: return character_equip_twoslot(this, item, subloc, Bracer1, Bracer2);
		default: return false;
	}
}